

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O0

wasm_ref_t * call_v_r(wasm_func_t *func)

{
  long lVar1;
  undefined8 local_48;
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_val_t rs [1];
  wasm_func_t *func_local;
  
  printf("call_v_r... ");
  fflush(_stdout);
  args.data = (wasm_val_t *)0x80;
  memset(&results.data,0,0x10);
  local_48 = 1;
  results.size = (size_t)&args.data;
  lVar1 = wasm_func_call(func,&results.data,&local_48);
  if (lVar1 != 0) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return (wasm_ref_t *)0x0;
}

Assistant:

own wasm_ref_t* call_v_r(const wasm_func_t* func) {
  printf("call_v_r... "); fflush(stdout);
  wasm_val_t rs[] = { WASM_INIT_VAL };
  wasm_val_vec_t args = WASM_EMPTY_VEC;
  wasm_val_vec_t results = WASM_ARRAY_VEC(rs);
  if (wasm_func_call(func, &args, &results)) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return rs[0].of.ref;
}